

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::GenericSoundEssenceDescriptor::Dump(GenericSoundEssenceDescriptor *this,FILE *stream)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  byte *pbVar4;
  Rational *this_00;
  char local_98 [8];
  char identbuf [128];
  FILE *stream_local;
  GenericSoundEssenceDescriptor *this_local;
  
  local_98[0] = '\0';
  identbuf._120_8_ = stream;
  if (stream == (FILE *)0x0) {
    identbuf._120_8_ = _stderr;
  }
  FileDescriptor::Dump(&this->super_FileDescriptor,(FILE *)identbuf._120_8_);
  uVar1 = identbuf._120_8_;
  pcVar3 = Rational::EncodeString(&this->AudioSamplingRate,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","AudioSamplingRate",pcVar3);
  fprintf((FILE *)identbuf._120_8_,"  %22s = %d\n","Locked",(ulong)this->Locked);
  bVar2 = optional_property<unsigned_char>::empty(&this->AudioRefLevel);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    pbVar4 = optional_property<unsigned_char>::get(&this->AudioRefLevel);
    fprintf((FILE *)uVar1,"  %22s = %d\n","AudioRefLevel",(ulong)*pbVar4);
  }
  bVar2 = optional_property<unsigned_char>::empty(&this->ElectroSpatialFormulation);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    pbVar4 = optional_property<unsigned_char>::get(&this->ElectroSpatialFormulation);
    fprintf((FILE *)uVar1,"  %22s = %d\n","ElectroSpatialFormulation",(ulong)*pbVar4);
  }
  fprintf((FILE *)identbuf._120_8_,"  %22s = %d\n","ChannelCount",(ulong)this->ChannelCount);
  fprintf((FILE *)identbuf._120_8_,"  %22s = %d\n","QuantizationBits",(ulong)this->QuantizationBits)
  ;
  bVar2 = optional_property<unsigned_char>::empty(&this->DialNorm);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    pbVar4 = optional_property<unsigned_char>::get(&this->DialNorm);
    fprintf((FILE *)uVar1,"  %22s = %d\n","DialNorm",(ulong)*pbVar4);
  }
  uVar1 = identbuf._120_8_;
  pcVar3 = UL::EncodeString(&this->SoundEssenceCoding,local_98,0x80);
  fprintf((FILE *)uVar1,"  %22s = %s\n","SoundEssenceCoding",pcVar3);
  bVar2 = optional_property<unsigned_char>::empty(&this->ReferenceAudioAlignmentLevel);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    pbVar4 = optional_property<unsigned_char>::get(&this->ReferenceAudioAlignmentLevel);
    fprintf((FILE *)uVar1,"  %22s = %d\n","ReferenceAudioAlignmentLevel",(ulong)*pbVar4);
  }
  bVar2 = optional_property<ASDCP::MXF::Rational>::empty(&this->ReferenceImageEditRate);
  uVar1 = identbuf._120_8_;
  if (!bVar2) {
    this_00 = optional_property<ASDCP::MXF::Rational>::get(&this->ReferenceImageEditRate);
    pcVar3 = Rational::EncodeString(this_00,local_98,0x80);
    fprintf((FILE *)uVar1,"  %22s = %s\n","ReferenceImageEditRate",pcVar3);
  }
  return;
}

Assistant:

void
GenericSoundEssenceDescriptor::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  FileDescriptor::Dump(stream);
  fprintf(stream, "  %22s = %s\n",  "AudioSamplingRate", AudioSamplingRate.EncodeString(identbuf, IdentBufferLen));
  fprintf(stream, "  %22s = %d\n",  "Locked", Locked);
  if ( ! AudioRefLevel.empty() ) {
    fprintf(stream, "  %22s = %d\n",  "AudioRefLevel", AudioRefLevel.get());
  }
  if ( ! ElectroSpatialFormulation.empty() ) {
    fprintf(stream, "  %22s = %d\n",  "ElectroSpatialFormulation", ElectroSpatialFormulation.get());
  }
  fprintf(stream, "  %22s = %d\n",  "ChannelCount", ChannelCount);
  fprintf(stream, "  %22s = %d\n",  "QuantizationBits", QuantizationBits);
  if ( ! DialNorm.empty() ) {
    fprintf(stream, "  %22s = %d\n",  "DialNorm", DialNorm.get());
  }
  fprintf(stream, "  %22s = %s\n",  "SoundEssenceCoding", SoundEssenceCoding.EncodeString(identbuf, IdentBufferLen));
  if ( ! ReferenceAudioAlignmentLevel.empty() ) {
    fprintf(stream, "  %22s = %d\n",  "ReferenceAudioAlignmentLevel", ReferenceAudioAlignmentLevel.get());
  }
  if ( ! ReferenceImageEditRate.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "ReferenceImageEditRate", ReferenceImageEditRate.get().EncodeString(identbuf, IdentBufferLen));
  }
}